

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreFactory.cpp
# Opt level: O0

shared_ptr<helics::Core> helics::CoreFactory::findJoinableCoreOfType(CoreType type)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  anon_class_1_0_00000001 *in_RDI;
  shared_ptr<helics::Core> sVar1;
  CoreType in_stack_0000003c;
  function<bool_(const_std::shared_ptr<helics::Core>_&)> *in_stack_00000040;
  SearchableObjectHolder<helics::Core,_helics::CoreType> *in_stack_00000048;
  function<bool_(const_std::shared_ptr<helics::Core>_&)> local_30;
  
  std::function<bool(std::shared_ptr<helics::Core>const&)>::
  function<helics::CoreFactory::findJoinableCoreOfType(helics::CoreType)::__0,void>
            (&local_30,in_RDI);
  gmlc::concurrency::SearchableObjectHolder<helics::Core,_helics::CoreType>::findObject
            (in_stack_00000048,in_stack_00000040,in_stack_0000003c);
  std::function<bool_(const_std::shared_ptr<helics::Core>_&)>::~function
            ((function<bool_(const_std::shared_ptr<helics::Core>_&)> *)0x42f624);
  sVar1.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)in_RDI
  ;
  return (shared_ptr<helics::Core>)
         sVar1.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Core> findJoinableCoreOfType(CoreType type)
{
    return searchableCores.findObject([](auto& ptr) { return ptr->isOpenToNewFederates(); }, type);
}